

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_array_ops.cpp
# Opt level: O0

Reals __thiscall Omega_h::divide_each_maybe_zero(Omega_h *this,Reals *a,Reals *b)

{
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *pvVar1;
  Reals RVar2;
  Write<double> local_178;
  undefined1 local_168 [8];
  type f;
  allocator local_119;
  string local_118 [32];
  undefined1 local_f8 [8];
  Write<double> c;
  int width;
  Reals *b_local;
  Reals *a_local;
  ulong local_60;
  ulong local_50;
  ulong local_40;
  ulong local_30;
  ulong local_20;
  ulong local_10;
  
  if (((ulong)(b->write_).shared_alloc_.alloc & 1) == 0) {
    local_10 = ((b->write_).shared_alloc_.alloc)->size;
  }
  else {
    local_10 = (ulong)(b->write_).shared_alloc_.alloc >> 3;
  }
  if ((int)(local_10 >> 3) == 0) {
    if (((ulong)(a->write_).shared_alloc_.alloc & 1) == 0) {
      local_20 = ((a->write_).shared_alloc_.alloc)->size;
    }
    else {
      local_20 = (ulong)(a->write_).shared_alloc_.alloc >> 3;
    }
    if ((int)(local_20 >> 3) != 0) {
      fail("assertion %s failed at %s +%d\n","a.size() == 0",
           "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_array_ops.cpp"
           ,0x8f);
    }
    Read<double>::Read((Read<double> *)this,(Read<signed_char> *)a);
    pvVar1 = extraout_RDX;
  }
  else {
    if (((ulong)(a->write_).shared_alloc_.alloc & 1) == 0) {
      local_30 = ((a->write_).shared_alloc_.alloc)->size;
    }
    else {
      local_30 = (ulong)(a->write_).shared_alloc_.alloc >> 3;
    }
    if (((ulong)(b->write_).shared_alloc_.alloc & 1) == 0) {
      local_40 = ((b->write_).shared_alloc_.alloc)->size;
    }
    else {
      local_40 = (ulong)(b->write_).shared_alloc_.alloc >> 3;
    }
    c.shared_alloc_.direct_ptr._4_4_ =
         divide_no_remainder<int>((int)(local_30 >> 3),(int)(local_40 >> 3));
    if (((ulong)(a->write_).shared_alloc_.alloc & 1) == 0) {
      local_50 = ((a->write_).shared_alloc_.alloc)->size;
    }
    else {
      local_50 = (ulong)(a->write_).shared_alloc_.alloc >> 3;
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_118,"",&local_119);
    Write<double>::Write((Write<double> *)local_f8,(LO)(local_50 >> 3),(string *)local_118);
    std::__cxx11::string::~string(local_118);
    std::allocator<char>::~allocator((allocator<char> *)&local_119);
    Read<double>::Read((Read<double> *)local_168,b);
    f.b.write_.shared_alloc_.direct_ptr._0_4_ = c.shared_alloc_.direct_ptr._4_4_;
    Write<double>::Write((Write<double> *)&f.width,(Write<double> *)local_f8);
    Read<double>::Read((Read<double> *)&f.c.shared_alloc_.direct_ptr,a);
    if (((ulong)(b->write_).shared_alloc_.alloc & 1) == 0) {
      local_60 = ((b->write_).shared_alloc_.alloc)->size;
    }
    else {
      local_60 = (ulong)(b->write_).shared_alloc_.alloc >> 3;
    }
    parallel_for<Omega_h::divide_each_maybe_zero(Omega_h::Read<double>,Omega_h::Read<double>)::__0>
              ((LO)(local_60 >> 3),(type *)local_168,"divide_maybe_zero");
    Write<double>::Write(&local_178,(Write<signed_char> *)local_f8);
    Read<double>::Read((Read<double> *)this,&local_178);
    Write<double>::~Write(&local_178);
    divide_each_maybe_zero(Omega_h::Read<double>,Omega_h::Read<double>)::$_0::~__0((__0 *)local_168)
    ;
    Write<double>::~Write((Write<double> *)local_f8);
    pvVar1 = extraout_RDX_00;
  }
  RVar2.write_.shared_alloc_.direct_ptr = pvVar1;
  RVar2.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Reals)RVar2.write_.shared_alloc_;
}

Assistant:

Reals divide_each_maybe_zero(Reals a, Reals b) {
  if (b.size() == 0) {
    OMEGA_H_CHECK(a.size() == 0);
    return a;
  }
  auto width = divide_no_remainder(a.size(), b.size());
  Write<Real> c(a.size());
  auto f = OMEGA_H_LAMBDA(LO i) {
    if (b[i] != 0.0) {
      for (Int j = 0; j < width; ++j) {
        c[i * width + j] = a[i * width + j] / b[i];
      }
    } else {
      for (Int j = 0; j < width; ++j) {
        OMEGA_H_CHECK(a[i * width + j] == 0.0);
        c[i * width + j] = 0.0;
      }
    }
  };
  parallel_for(b.size(), f, "divide_maybe_zero");
  return c;
}